

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

_Bool ARM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  uint8_t *puVar1;
  cs_detail *__s;
  uint uVar2;
  DecodeStatus DVar3;
  void *Decoder;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t Address;
  uint uVar4;
  long lVar5;
  MCRegisterInfo *MRI;
  int feature;
  DecodeStatus DVar6;
  
  feature = (int)address;
  DVar6 = MCDisassembler_Fail;
  if (code_len < 4) goto LAB_001db930;
  __s = instr->flat_insn->detail;
  MRI = (MCRegisterInfo *)size;
  if (__s != (cs_detail *)0x0) {
    lVar5 = 0;
    memset(__s,0,0x740);
    do {
      puVar1 = instr->flat_insn->detail->groups + lVar5 + 0x35;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      instr->flat_insn->detail->groups[lVar5 + 0x5f] = 0xff;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x6c0);
  }
  uVar2 = (uint)code[3];
  if ((int)*(uint *)(ud + 4) < 0) {
    uVar4 = (uint)*code << 0x18 | (uint)code[1] << 0x10 | (uint)code[2] << 8;
  }
  else {
    uVar2 = (uint)code[1] << 8 | (uint)code[2] << 0x10 | (uint)code[3] << 0x18;
    uVar4 = (uint)*code;
  }
  uVar4 = uVar4 | uVar2;
  DVar3 = decodeInstruction_4("\x01\x19\x03\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,feature);
  if (DVar3 == MCDisassembler_Fail) {
    MCInst_clear(instr);
    DVar3 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,feature)
    ;
    if (DVar3 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      DVar3 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,
                                  feature);
      if (DVar3 == MCDisassembler_Fail) {
        MCInst_clear(instr);
        Decoder = (void *)(ulong)*(uint *)(ud + 4);
        DVar3 = decodeInstruction_4("\x01\x04\x01\x02",instr,uVar4,(uint64_t)Decoder,MRI,feature);
        Address = extraout_RDX;
        if (DVar3 == MCDisassembler_Fail) {
          MCInst_clear(instr);
          Decoder = (void *)(ulong)*(uint *)(ud + 4);
          DVar3 = decodeInstruction_4("\x01\b\x04\x02",instr,uVar4,(uint64_t)Decoder,MRI,feature);
          Address = extraout_RDX_00;
          if (DVar3 == MCDisassembler_Fail) {
            MCInst_clear(instr);
            Decoder = (void *)(ulong)*(uint *)(ud + 4);
            DVar3 = decodeInstruction_4("\x01\x16\x06\x028i",instr,uVar4,(uint64_t)Decoder,MRI,
                                        feature);
            Address = extraout_RDX_01;
            if (DVar3 == MCDisassembler_Fail) {
              MCInst_clear(instr);
              DVar3 = decodeInstruction_4("\x01\b\x04\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),MRI,
                                          feature);
              if (DVar3 == MCDisassembler_Fail) {
                MCInst_clear(instr);
                DVar3 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar4,(ulong)*(uint *)(ud + 4),
                                            MRI,feature);
                if (DVar3 == MCDisassembler_Fail) {
                  MCInst_clear(instr);
                  *size = 0;
                  goto LAB_001db930;
                }
              }
              goto LAB_001db925;
            }
          }
        }
        DVar6 = DVar3;
        *size = 4;
        DVar3 = DecodePredicateOperand(instr,0xe,Address,Decoder);
        if (DVar3 == MCDisassembler_Fail) {
          DVar6 = MCDisassembler_Fail;
        }
        goto LAB_001db930;
      }
    }
  }
  else {
    uVar2 = MCInst_getOpcode(instr);
    if (((uVar2 == 0x74) && (uVar4 >> 0x1c != 0xe)) &&
       (DVar3 = MCDisassembler_Fail, uVar4 >> 0x1c != 0xf)) {
      DVar3 = MCDisassembler_SoftFail;
    }
    if (DVar3 == MCDisassembler_Fail) {
      DVar6 = MCDisassembler_Fail;
      goto LAB_001db930;
    }
  }
LAB_001db925:
  *size = 4;
  DVar6 = MCDisassembler_SoftFail;
LAB_001db930:
  return DVar6 != MCDisassembler_Fail;
}

Assistant:

bool ARM_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _ARM_getInstruction((cs_struct *)ud, instr, code, code_len, size, address);

	//return status == MCDisassembler_Success;
	return status != MCDisassembler_Fail;
}